

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwizard.cpp
# Opt level: O1

QVariant * __thiscall QWizard::field(QVariant *__return_storage_ptr__,QWizard *this,QString *name)

{
  long lVar1;
  long lVar2;
  const_iterator cVar3;
  _Base_ptr *pp_Var4;
  undefined4 local_1c;
  
  lVar1 = *(long *)&(this->super_QDialog).super_QWidget.field_0x8;
  local_1c = 0xffffffff;
  lVar2 = *(long *)(lVar1 + 0x300);
  if (lVar2 == 0) {
    pp_Var4 = (_Base_ptr *)&local_1c;
  }
  else {
    cVar3 = std::
            _Rb_tree<QString,_std::pair<const_QString,_int>,_std::_Select1st<std::pair<const_QString,_int>_>,_std::less<QString>,_std::allocator<std::pair<const_QString,_int>_>_>
            ::find((_Rb_tree<QString,_std::pair<const_QString,_int>,_std::_Select1st<std::pair<const_QString,_int>_>,_std::less<QString>,_std::allocator<std::pair<const_QString,_int>_>_>
                    *)(lVar2 + 8),name);
    pp_Var4 = (_Base_ptr *)&local_1c;
    if (cVar3._M_node != (_Base_ptr)(*(long *)(lVar1 + 0x300) + 0x10)) {
      pp_Var4 = &cVar3._M_node[1]._M_right;
    }
  }
  if (*(int *)pp_Var4 == -1) {
    field();
  }
  else {
    QObject::property((char *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

QVariant QWizard::field(const QString &name) const
{
    Q_D(const QWizard);

    int index = d->fieldIndexMap.value(name, -1);
    if (Q_UNLIKELY(index == -1)) {
        qWarning("QWizard::field: No such field '%ls'", qUtf16Printable(name));
        return QVariant();
    }

    const QWizardField &field = d->fields.at(index);
    return field.object->property(field.property);
}